

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void setup_cdef(AV1_COMMON *cm,aom_read_bit_buffer *rb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  AV1_COMMON *in_RDI;
  int i;
  CdefInfo *cdef_info;
  int num_planes;
  int local_28;
  int in_stack_ffffffffffffffdc;
  aom_read_bit_buffer *rb_00;
  
  iVar1 = av1_num_planes(in_RDI);
  rb_00 = (aom_read_bit_buffer *)&in_RDI->cdef_info;
  if (((in_RDI->features).allow_intrabc & 1U) == 0) {
    iVar2 = aom_rb_read_literal(rb_00,in_stack_ffffffffffffffdc);
    *(int *)&rb_00[2].error_handler = iVar2 + 3;
    iVar2 = aom_rb_read_literal(rb_00,in_stack_ffffffffffffffdc);
    *(int *)&rb_00[6].bit_buffer_end = iVar2;
    *(int *)((long)&rb_00[2].error_handler + 4) =
         1 << ((byte)*(undefined4 *)&rb_00[6].bit_buffer_end & 0x1f);
    for (iVar2 = 0; iVar2 < *(int *)((long)&rb_00[2].error_handler + 4); iVar2 = iVar2 + 1) {
      iVar3 = aom_rb_read_literal(rb_00,iVar2);
      *(int *)((long)&rb_00[3].bit_buffer + (long)iVar2 * 4) = iVar3;
      if (iVar1 < 2) {
        local_28 = 0;
      }
      else {
        local_28 = aom_rb_read_literal(rb_00,iVar2);
      }
      *(int *)((long)&rb_00[4].error_handler_data + (long)iVar2 * 4) = local_28;
    }
  }
  return;
}

Assistant:

static inline void setup_cdef(AV1_COMMON *cm, struct aom_read_bit_buffer *rb) {
  const int num_planes = av1_num_planes(cm);
  CdefInfo *const cdef_info = &cm->cdef_info;

  if (cm->features.allow_intrabc) return;
  cdef_info->cdef_damping = aom_rb_read_literal(rb, 2) + 3;
  cdef_info->cdef_bits = aom_rb_read_literal(rb, 2);
  cdef_info->nb_cdef_strengths = 1 << cdef_info->cdef_bits;
  for (int i = 0; i < cdef_info->nb_cdef_strengths; i++) {
    cdef_info->cdef_strengths[i] = aom_rb_read_literal(rb, CDEF_STRENGTH_BITS);
    cdef_info->cdef_uv_strengths[i] =
        num_planes > 1 ? aom_rb_read_literal(rb, CDEF_STRENGTH_BITS) : 0;
  }
}